

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O1

int picnic_impl_sign(picnic_instance_t *pp,picnic_context_t *context,uint8_t *sig,size_t *siglen)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  picnic_context_t *ppVar14;
  view_t *pvVar15;
  undefined1 auVar16 [64];
  int iVar17;
  recorded_state_t *state;
  ulong uVar18;
  BitSequence *pBVar19;
  void *pvVar20;
  long lVar21;
  byte *pbVar22;
  picnic_instance_t *ppVar23;
  ulong uVar24;
  BitSequence *pBVar25;
  uint j_10;
  Keccak_HashInstancetimes4 *instance;
  uint8_t *puVar26;
  mzd_local_t *pmVar27;
  mzd_local_t (*pamVar28) [1];
  kdf_shake_x4_t *pkVar29;
  ulong uVar30;
  long lVar31;
  byte *pbVar32;
  picnic_instance_t *ppVar33;
  uint uVar34;
  uint j;
  BitLength databitlen;
  uint8_t *puVar35;
  uint j_7;
  uint uVar36;
  ulong uVar37;
  uint16_t round_numbers [4];
  in_out_shares_t in_out_shares;
  uint16_t data_le;
  uint8_t public_key [32];
  proof_round_t *local_d30;
  uint8_t *local_d28;
  undefined1 local_d20 [16];
  BitSequence *pBStack_d10;
  uint8_t *puStack_d08;
  BitSequence *local_cf8;
  ulong local_cf0;
  undefined8 local_ce8;
  ushort local_cda;
  picnic_context_t *local_cd8;
  picnic_instance_t *local_cd0;
  BitSequence *local_cc8;
  view_t *local_cc0;
  undefined8 local_cb8;
  uint local_cac;
  undefined1 *local_ca8;
  ulong local_ca0;
  view_t *local_c98;
  uint local_c8c;
  mzd_local_t *local_c88;
  ulong local_c80;
  uint8_t *local_c78;
  recorded_state_t *local_c70;
  uint local_c68;
  int local_c64;
  uint8_t *local_c60;
  ulong local_c58;
  BitSequence *local_c50;
  BitSequence *local_c48;
  BitSequence *local_c40;
  zkbpp_lowmc_implementation_f local_c38;
  ulong local_c30;
  ulong local_c28;
  undefined1 local_c20 [16];
  undefined1 auStack_c10 [16];
  undefined1 local_c00 [16];
  undefined1 auStack_bf0 [16];
  undefined1 local_be0 [56];
  size_t *local_ba8;
  long local_ba0;
  ulong local_b98;
  ulong local_b90;
  ulong local_b88;
  undefined1 local_b80 [16];
  uint8_t *puStack_b70;
  uint8_t *puStack_b68;
  undefined1 auStack_b60 [32];
  undefined1 local_b40 [64];
  BitSequence local_b00 [64];
  undefined1 local_ac0 [96];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  kdf_shake_x4_t local_a20 [3];
  
  local_cac = (uint)pp->num_rounds;
  local_cf0 = (ulong)pp->input_output_size;
  local_ca0 = (ulong)pp->view_size;
  uVar5 = (pp->lowmc).n;
  local_c60 = sig;
  local_ba8 = siglen;
  local_c38 = get_zkbpp_lowmc_implementation(&pp->lowmc);
  state = (recorded_state_t *)aligned_alloc(0x20,(ulong)(pp->lowmc).r * 0x20 + 0x20);
  lowmc_record_state(&pp->lowmc,context->m_key,context->m_plaintext,state);
  local_a20[0].sponge.state[0] = '\0';
  local_a20[0].sponge.state[1] = '\0';
  local_a20[0].sponge.state[2] = '\0';
  local_a20[0].sponge.state[3] = '\0';
  local_a20[0].sponge.state[4] = '\0';
  local_a20[0].sponge.state[5] = '\0';
  local_a20[0].sponge.state[6] = '\0';
  local_a20[0].sponge.state[7] = '\0';
  local_a20[0].sponge.state[8] = '\0';
  local_a20[0].sponge.state[9] = '\0';
  local_a20[0].sponge.state[10] = '\0';
  local_a20[0].sponge.state[0xb] = '\0';
  local_a20[0].sponge.state[0xc] = '\0';
  local_a20[0].sponge.state[0xd] = '\0';
  local_a20[0].sponge.state[0xe] = '\0';
  local_a20[0].sponge.state[0xf] = '\0';
  local_a20[0].sponge.state[0x10] = '\0';
  local_a20[0].sponge.state[0x11] = '\0';
  local_a20[0].sponge.state[0x12] = '\0';
  local_a20[0].sponge.state[0x13] = '\0';
  local_a20[0].sponge.state[0x14] = '\0';
  local_a20[0].sponge.state[0x15] = '\0';
  local_a20[0].sponge.state[0x16] = '\0';
  local_a20[0].sponge.state[0x17] = '\0';
  local_a20[0].sponge.state[0x18] = '\0';
  local_a20[0].sponge.state[0x19] = '\0';
  local_a20[0].sponge.state[0x1a] = '\0';
  local_a20[0].sponge.state[0x1b] = '\0';
  local_a20[0].sponge.state[0x1c] = '\0';
  local_a20[0].sponge.state[0x1d] = '\0';
  local_a20[0].sponge.state[0x1e] = '\0';
  local_a20[0].sponge.state[0x1f] = '\0';
  mzd_to_char_array((uint8_t *)local_a20,state[(pp->lowmc).r].state,(ulong)pp->input_output_size);
  iVar17 = picnic_timingsafe_bcmp(context->public_key,local_a20,(ulong)pp->input_output_size);
  if (iVar17 == 0) {
    local_cb8 = (BitSequence *)(ulong)((int)local_ca0 + 7U & 0xfffffff8);
    bVar1 = pp->digest_size;
    bVar2 = pp->seed_size;
    uVar6 = pp->num_rounds;
    uVar18 = (ulong)uVar6;
    bVar3 = pp->input_output_size;
    uVar37 = (ulong)bVar3;
    bVar4 = pp->view_size;
    local_cd8 = context;
    local_c88 = context->m_key;
    local_c70 = state;
    pBVar19 = (BitSequence *)calloc(1,(ulong)((uint)uVar6 * 0x90) + 0x28);
    local_ce8 = (picnic_instance_t *)(ulong)bVar2;
    if (pBVar19 == (BitSequence *)0x0) {
      pBVar19 = (BitSequence *)0x0;
    }
    else {
      uVar34 = bVar4 + 7 & 0xfffffff8;
      uVar36 = (uint)bVar4 + (uint)bVar3;
      local_cc0 = (view_t *)(ulong)uVar36;
      local_cf8 = (BitSequence *)CONCAT71(local_cf8._1_7_,local_cd8->unruh);
      iVar17 = 0;
      if (local_cd8->unruh != false) {
        iVar17 = uVar36 * 3 + (uint)bVar3;
      }
      uVar24 = (ulong)(uVar6 + 7 & 0xfffffff8);
      local_cc8 = pBVar19;
      pvVar20 = calloc(1,uVar24 + 0x20 +
                         (ulong)((iVar17 + ((uint)bVar2 + (uint)bVar1 + (uint)bVar3 * 2 + uVar34) *
                                           3) * (uint)uVar6));
      *(void **)(local_cc8 + 0x20) = pvVar20;
      lVar21 = (long)pvVar20 + uVar24;
      if (uVar6 != 0) {
        pBVar19 = local_cc8 + 0x28;
        uVar24 = 0;
        do {
          lVar31 = 0;
          do {
            *(long *)(pBVar19 + lVar31 * 8) = lVar21;
            lVar21 = lVar21 + (long)&(local_ce8->lowmc).n;
            lVar31 = lVar31 + 1;
          } while (lVar31 != 3);
          uVar24 = uVar24 + 1;
          pBVar19 = pBVar19 + 0x90;
        } while (uVar24 != uVar18);
      }
      if (uVar6 != 0) {
        pBVar19 = local_cc8 + 0x40;
        uVar24 = 0;
        do {
          lVar31 = 0;
          do {
            *(long *)(pBVar19 + lVar31 * 8) = lVar21;
            lVar21 = lVar21 + (ulong)bVar1;
            lVar31 = lVar31 + 1;
          } while (lVar31 != 3);
          uVar24 = uVar24 + 1;
          pBVar19 = pBVar19 + 0x90;
        } while (uVar24 != uVar18);
      }
      if (uVar6 != 0) {
        pBVar19 = local_cc8 + 0x58;
        uVar24 = 0;
        do {
          lVar31 = 0;
          do {
            *(long *)(pBVar19 + lVar31 * 8) = lVar21;
            lVar21 = lVar21 + uVar37;
            lVar31 = lVar31 + 1;
          } while (lVar31 != 3);
          uVar24 = uVar24 + 1;
          pBVar19 = pBVar19 + 0x90;
        } while (uVar24 != uVar18);
      }
      if (uVar6 != 0) {
        pBVar19 = local_cc8 + 0x70;
        uVar24 = 0;
        do {
          lVar31 = 0;
          do {
            *(long *)(pBVar19 + lVar31 * 8) = lVar21;
            lVar21 = lVar21 + (ulong)uVar34;
            lVar31 = lVar31 + 1;
          } while (lVar31 != 3);
          uVar24 = uVar24 + 1;
          pBVar19 = pBVar19 + 0x90;
        } while (uVar24 != uVar18);
      }
      if (uVar6 != 0) {
        pBVar19 = local_cc8 + 0x88;
        uVar24 = 0;
        do {
          lVar31 = 0;
          do {
            *(long *)(pBVar19 + lVar31 * 8) = lVar21;
            lVar21 = lVar21 + uVar37;
            lVar31 = lVar31 + 1;
          } while (lVar31 != 3);
          uVar24 = uVar24 + 1;
          pBVar19 = pBVar19 + 0x90;
        } while (uVar24 != uVar18);
      }
      pBVar19 = local_cc8;
      if (uVar18 != 0 && (char)local_cf8 == '\x01') {
        pBVar25 = local_cc8 + 0xa0;
        uVar24 = 0;
        do {
          lVar31 = 0;
          do {
            *(long *)(pBVar25 + lVar31 * 8) = lVar21;
            lVar21 = lVar21 + ((ulong)local_cc0 & 0xffffffff);
            lVar31 = lVar31 + 1;
          } while (lVar31 != 3);
          lVar21 = lVar21 + uVar37;
          uVar24 = uVar24 + 1;
          pBVar25 = pBVar25 + 0x90;
        } while (uVar24 != uVar18);
      }
    }
    local_c58 = (ulong)(uint)((int)local_cf0 * 8);
    local_cc0 = (view_t *)aligned_alloc(0x20,(ulong)(pp->lowmc).r * 0x60);
    local_cf8 = *(BitSequence **)(pBVar19 + 0x28);
    if (bVar1 == 0x20) {
      uVar36 = 0x540;
      uVar34 = 0x100;
    }
    else {
      uVar36 = 0x440;
      uVar34 = 0x200;
    }
    local_cc8 = pBVar19;
    Keccak_HashInitialize((Keccak_HashInstance *)local_a20,uVar36,uVar34,0,'\x1f');
    pBVar19 = local_cc8;
    ppVar14 = local_cd8;
    local_c8c = (int)local_c58 - (uint)uVar5;
    local_d30 = (proof_round_t *)(local_cc8 + 0x28);
    databitlen = (ulong)bVar3 << 3;
    Keccak_HashUpdate((Keccak_HashInstance *)local_a20,local_cd8->private_key,databitlen);
    Keccak_HashUpdate((Keccak_HashInstance *)local_a20,ppVar14->msg,ppVar14->msglen << 3);
    Keccak_HashUpdate((Keccak_HashInstance *)local_a20,ppVar14->public_key,databitlen);
    Keccak_HashUpdate((Keccak_HashInstance *)local_a20,ppVar14->plaintext,databitlen);
    local_b80._0_2_ = (pp->lowmc).n;
    Keccak_HashUpdate((Keccak_HashInstance *)local_a20,local_b80,0x10);
    uVar18 = 0;
    Keccak_HashFinal((Keccak_HashInstance *)local_a20,(BitSequence *)0x0);
    local_d28._0_4_ = (uint)uVar6;
    Keccak_HashSqueeze((Keccak_HashInstance *)local_a20,local_cf8,
                       (ulong)((int)local_ce8 * (uint)local_d28 * 8) * 3);
    Keccak_HashSqueeze((Keccak_HashInstance *)local_a20,pBVar19,0x100);
    local_c98 = (view_t *)aligned_alloc(0x20,(ulong)(pp->lowmc).r * 0x60);
    pBVar19 = local_cb8;
    local_c78 = (uint8_t *)aligned_alloc(8,(ulong)(uint)((int)local_cb8 * 4) * 3);
    local_c68 = local_cac & 0xfffc;
    local_cd0 = pp;
    if (local_c68 != 0) {
      local_b88 = (ulong)(uint)((int)local_ca0 * 8);
      local_b90 = (ulong)((int)local_cf0 - 1);
      local_c64 = 0xff << (local_c8c & 0x1f);
      local_cf8 = local_b00;
      local_ca8 = local_ac0;
      local_c28 = (ulong)pBVar19 & 0xffffffff;
      local_a40 = vpbroadcastq_avx512vl();
      local_a60 = vpbroadcastq_avx512vl();
      pBVar19 = local_cc8 + 0x208;
      uVar34 = (int)local_ca0 + 7;
      uVar36 = uVar34 >> 3;
      local_ba0 = (ulong)(uVar34 & 0xfffffff8) * 3;
      local_c30 = (ulong)(uVar36 << 5);
      local_b98 = (ulong)(uVar36 << 4);
      local_c48 = local_cc8 + 0x58;
      local_c50 = local_cc8 + 0x88;
      uVar18 = 0;
      do {
        pkVar29 = local_a20;
        local_ce8 = (picnic_instance_t *)(CONCAT44(local_ce8._4_4_,(int)uVar18) | 2);
        local_cb8 = (BitSequence *)(CONCAT44(local_cb8._4_4_,(int)uVar18) | 3);
        lVar21 = 0;
        local_c80 = uVar18;
        local_c40 = pBVar19;
        do {
          auVar16 = _local_b80;
          local_b80._8_8_ = local_d30[1].seeds[lVar21];
          local_b80._0_8_ = local_d30->seeds[lVar21];
          puStack_b70 = local_d30[2].seeds[lVar21];
          auStack_b60 = auVar16._32_32_;
          puStack_b68 = local_d30[3].seeds[lVar21];
          local_d20._0_8_ =
               CONCAT26((short)local_cb8,
                        CONCAT24((short)local_ce8,CONCAT22((short)uVar18,(short)local_c80))) |
               0x10000;
          kdf_init_x4_from_seed
                    (pkVar29,(uint8_t **)local_b80,local_cc8,(uint16_t *)local_d20,(uint16_t)lVar21,
                     lVar21 != 2,pp);
          pBVar19 = local_c40;
          uVar37 = local_c58;
          lVar21 = lVar21 + 1;
          pkVar29 = pkVar29 + 1;
        } while (lVar21 != 3);
        instance = local_a20;
        lVar21 = 0;
        do {
          auVar16 = _local_b80;
          local_b80._8_8_ = *(undefined8 *)(pBVar19 + lVar21 * 8 + -0x120);
          local_b80._0_8_ = *(undefined8 *)(pBVar19 + lVar21 * 8 + -0x1b0);
          puStack_b70 = (uint8_t *)*(undefined8 *)(pBVar19 + lVar21 * 8 + -0x90);
          auStack_b60 = auVar16._32_32_;
          puStack_b68 = (uint8_t *)*(undefined8 *)(pBVar19 + lVar21 * 8);
          Keccak_HashSqueezetimes4(instance,(BitSequence **)local_b80,uVar37);
          lVar31 = local_ba0;
          uVar24 = local_c28;
          uVar18 = local_c30;
          lVar21 = lVar21 + 1;
          instance = instance + 1;
        } while (lVar21 == 1);
        lVar21 = 0;
        puVar26 = local_c78;
        do {
          auVar16 = _local_b80;
          local_b80._8_8_ = puVar26 + uVar24;
          local_b80._0_8_ = puVar26;
          puStack_b70 = puVar26 + local_b98;
          auStack_b60 = auVar16._32_32_;
          puStack_b68 = puVar26 + lVar31;
          Keccak_HashSqueezetimes4
                    ((Keccak_HashInstancetimes4 *)(local_a20[0].sponge.state + lVar21),
                     (BitSequence **)local_b80,local_b88);
          lVar21 = lVar21 + 0x338;
          puVar26 = puVar26 + uVar18;
        } while (lVar21 != 0x9a8);
        local_d28 = local_c78;
        local_ce8 = (picnic_instance_t *)0x0;
        pBVar25 = local_c48;
        pBVar19 = local_c50;
        do {
          uVar18 = local_b90;
          iVar17 = local_c64;
          pmVar27 = (mzd_local_t *)local_c20;
          lVar21 = 0;
          local_cb8 = pBVar19;
          do {
            *(byte *)(*(long *)(pBVar25 + lVar21 * 8) + uVar18) =
                 *(byte *)(*(long *)(pBVar25 + lVar21 * 8) + uVar18) & (byte)iVar17;
            mzd_from_char_array(pmVar27,*(uint8_t **)(pBVar25 + lVar21 * 8),local_cf0);
            lVar21 = lVar21 + 1;
            pmVar27 = pmVar27 + 1;
          } while (lVar21 == 1);
          uVar5 = (local_cd0->lowmc).n;
          if ((~DAT_001c939c & 0x20400) == 0) {
            if (uVar5 < 0x81) {
              local_be0._0_16_ =
                   vpternlogq_avx512vl(*(undefined1 (*) [16])local_c88->w64,local_c00,local_c20,0x96
                                      );
            }
            else {
              auVar12._16_16_ = auStack_bf0;
              auVar12._0_16_ = local_c00;
              auVar10._16_16_ = auStack_c10;
              auVar10._0_16_ = local_c20;
              local_be0._0_32_ =
                   vpternlogq_avx512vl(*(undefined1 (*) [32])local_c88->w64,auVar12,auVar10,0x96);
            }
          }
          else {
            local_be0._0_16_ =
                 vpternlogq_avx512vl(*(undefined1 (*) [16])local_c88->w64,local_c00,local_c20,0x96);
            if (0x80 < uVar5) {
              local_be0._16_16_ =
                   vpternlogq_avx512vl(*(undefined1 (*) [16])(local_cd8->m_key[0].w64 + 2),
                                       auStack_bf0,auStack_c10,0x96);
            }
          }
          mzd_to_char_array(local_d30[(long)local_ce8].input_shares[2],(mzd_local_t *)local_be0,
                            local_cf0);
          uVar18 = local_c30;
          pvVar15 = local_c98;
          lVar21 = 0;
          puVar26 = local_d28;
          do {
            decompress_view(pvVar15,local_cd0,puVar26,(uint)lVar21);
            lVar21 = lVar21 + 1;
            puVar26 = puVar26 + uVar18;
          } while (lVar21 != 3);
          pamVar28 = (mzd_local_t (*) [1])local_c20;
          (*local_c38)(local_cd8->m_plaintext,local_cc0,(in_out_shares_t *)pamVar28,pvVar15,
                       local_c70);
          pBVar19 = local_cb8;
          uVar18 = local_cf0;
          lVar21 = 0;
          do {
            mzd_to_char_array(*(uint8_t **)(pBVar19 + lVar21 * 8),*pamVar28,uVar18);
            compress_view(*(uint8_t **)(pBVar19 + lVar21 * 8 + -0x18),local_cd0,local_cc0,
                          (uint)lVar21);
            lVar21 = lVar21 + 1;
            pamVar28 = pamVar28 + 1;
          } while (lVar21 != 3);
          local_ce8 = (picnic_instance_t *)((long)local_ce8 + 1);
          pBVar25 = pBVar25 + 0x90;
          local_d28 = local_d28 + local_c28;
          pBVar19 = pBVar19 + 0x90;
        } while (local_ce8 != (picnic_instance_t *)0x4);
        lVar21 = 0;
        local_ce8 = (picnic_instance_t *)0x4;
        pp = local_cd0;
        do {
          bVar1 = pp->digest_size;
          local_d20[0] = 4;
          if (bVar1 == 0x20) {
            uVar36 = 0x540;
            uVar34 = 0x100;
          }
          else {
            uVar36 = 0x440;
            uVar34 = 0x200;
          }
          Keccak_HashInitializetimes4(local_a20,uVar36,uVar34,0,'\x1f');
          _local_b80 = local_a60;
          Keccak_HashUpdatetimes4(local_a20,(BitSequence **)local_b80,8);
          local_b80._8_8_ = local_d30[1].seeds[lVar21];
          local_b80._0_8_ = local_d30->seeds[lVar21];
          puStack_b70 = local_d30[2].seeds[lVar21];
          puStack_b68 = local_d30[3].seeds[lVar21];
          Keccak_HashUpdatetimes4(local_a20,(BitSequence **)local_b80,(ulong)pp->seed_size << 3);
          Keccak_HashFinaltimes4(local_a20,(BitSequence **)0x0);
          local_d20._8_8_ = local_b40;
          local_d20._0_8_ = local_b80;
          pBStack_d10 = local_cf8;
          puStack_d08 = local_ca8;
          uVar18 = (ulong)((uint)bVar1 * 8);
          Keccak_HashSqueezetimes4(local_a20,(BitSequence **)local_d20,uVar18);
          local_cda = local_cda & 0xff00;
          if (bVar1 == 0x20) {
            uVar36 = 0x540;
            uVar34 = 0x100;
          }
          else {
            uVar36 = 0x440;
            uVar34 = 0x200;
          }
          Keccak_HashInitializetimes4(local_a20,uVar36,uVar34,0,'\x1f');
          _local_d20 = local_a40;
          Keccak_HashUpdatetimes4(local_a20,(BitSequence **)local_d20,8);
          local_d20._8_8_ = local_b40;
          local_d20._0_8_ = local_b80;
          pBStack_d10 = local_cf8;
          puStack_d08 = local_ca8;
          Keccak_HashUpdatetimes4(local_a20,(BitSequence **)local_d20,uVar18);
          pp = local_cd0;
          local_d20._8_8_ = local_d30[1].input_shares[lVar21];
          local_d20._0_8_ = local_d30->input_shares[lVar21];
          pBStack_d10 = local_d30[2].input_shares[lVar21];
          puStack_d08 = local_d30[3].input_shares[lVar21];
          Keccak_HashUpdatetimes4
                    (local_a20,(BitSequence **)local_d20,(ulong)local_cd0->input_output_size << 3);
          local_d20._8_8_ = local_d30[1].communicated_bits[lVar21];
          local_d20._0_8_ = local_d30->communicated_bits[lVar21];
          pBStack_d10 = local_d30[2].communicated_bits[lVar21];
          puStack_d08 = local_d30[3].communicated_bits[lVar21];
          Keccak_HashUpdatetimes4(local_a20,(BitSequence **)local_d20,(ulong)pp->view_size << 3);
          local_d20._8_8_ = local_d30[1].output_shares[lVar21];
          local_d20._0_8_ = local_d30->output_shares[lVar21];
          pBStack_d10 = local_d30[2].output_shares[lVar21];
          puStack_d08 = local_d30[3].output_shares[lVar21];
          Keccak_HashUpdatetimes4
                    (local_a20,(BitSequence **)local_d20,(ulong)pp->input_output_size << 3);
          Keccak_HashFinaltimes4(local_a20,(BitSequence **)0x0);
          local_d20._8_8_ = local_d30[1].commitments[lVar21];
          local_d20._0_8_ = local_d30->commitments[lVar21];
          pBStack_d10 = local_d30[2].commitments[lVar21];
          puStack_d08 = local_d30[3].commitments[lVar21];
          Keccak_HashSqueezetimes4(local_a20,(BitSequence **)local_d20,uVar18);
          lVar21 = lVar21 + 1;
        } while (lVar21 != 3);
        if (local_cd8->unruh == true) {
          lVar21 = 0;
          do {
            bVar1 = pp->digest_size;
            local_d20[0] = 5;
            if (bVar1 == 0x20) {
              uVar36 = 0x540;
              uVar34 = 0x100;
            }
            else {
              uVar36 = 0x440;
              uVar34 = 0x200;
            }
            Keccak_HashInitializetimes4(local_a20,uVar36,uVar34,0,'\x1f');
            _local_b80 = local_a60;
            Keccak_HashUpdatetimes4(local_a20,(BitSequence **)local_b80,8);
            local_b80._8_8_ = local_d30[1].seeds[lVar21];
            local_b80._0_8_ = local_d30->seeds[lVar21];
            puStack_b70 = local_d30[2].seeds[lVar21];
            puStack_b68 = local_d30[3].seeds[lVar21];
            Keccak_HashUpdatetimes4(local_a20,(BitSequence **)local_b80,(ulong)pp->seed_size << 3);
            Keccak_HashFinaltimes4(local_a20,(BitSequence **)0x0);
            local_d20._8_8_ = local_b40;
            local_d20._0_8_ = local_b80;
            pBStack_d10 = local_cf8;
            puStack_d08 = local_ca8;
            Keccak_HashSqueezetimes4(local_a20,(BitSequence **)local_d20,(ulong)((uint)bVar1 * 8));
            if (bVar1 == 0x20) {
              uVar36 = 0x540;
              uVar34 = 0x100;
            }
            else {
              uVar36 = 0x440;
              uVar34 = 0x200;
            }
            Keccak_HashInitializetimes4(local_a20,uVar36,uVar34,0,'\x1f');
            local_d20._8_8_ = local_b40;
            local_d20._0_8_ = local_b80;
            pBStack_d10 = local_cf8;
            puStack_d08 = local_ca8;
            Keccak_HashUpdatetimes4(local_a20,(BitSequence **)local_d20,(ulong)((uint)bVar1 * 8));
            if (lVar21 == 2) {
              local_d20._8_8_ = local_d30[1].input_shares[2];
              local_d20._0_8_ = local_d30->input_shares[2];
              pBStack_d10 = local_d30[2].input_shares[2];
              puStack_d08 = local_d30[3].input_shares[2];
              Keccak_HashUpdatetimes4
                        (local_a20,(BitSequence **)local_d20,(ulong)pp->input_output_size << 3);
            }
            local_d20._8_8_ = local_d30[1].communicated_bits[lVar21];
            local_d20._0_8_ = local_d30->communicated_bits[lVar21];
            pBStack_d10 = local_d30[2].communicated_bits[lVar21];
            puStack_d08 = local_d30[3].communicated_bits[lVar21];
            Keccak_HashUpdatetimes4(local_a20,(BitSequence **)local_d20,(ulong)pp->view_size << 3);
            uVar34 = 0;
            if (lVar21 == 2) {
              uVar34 = (uint)pp->input_output_size;
            }
            iVar17 = (uint)pp->view_size + (uint)pp->input_output_size + uVar34;
            local_cda = (ushort)iVar17;
            _local_d20 = local_a40;
            Keccak_HashUpdatetimes4(local_a20,(BitSequence **)local_d20,0x10);
            Keccak_HashFinaltimes4(local_a20,(BitSequence **)0x0);
            local_d20._8_8_ = local_d30[1].gs[lVar21];
            local_d20._0_8_ = local_d30->gs[lVar21];
            pBStack_d10 = local_d30[2].gs[lVar21];
            puStack_d08 = local_d30[3].gs[lVar21];
            Keccak_HashSqueezetimes4(local_a20,(BitSequence **)local_d20,(ulong)(uint)(iVar17 * 8));
            lVar21 = lVar21 + 1;
          } while (lVar21 != 3);
        }
        uVar34 = (int)local_c80 + 4;
        uVar18 = (ulong)uVar34;
        local_d30 = local_d30 + 4;
        pBVar19 = local_c40 + 0x240;
        local_c48 = local_c48 + 0x240;
        local_c50 = local_c50 + 0x240;
      } while (uVar34 < local_c68);
    }
    if ((uint)uVar18 < local_cac) {
      iVar17 = (int)local_cf0;
      local_cf8 = (BitSequence *)(ulong)(iVar17 - 1);
      local_ce8 = (picnic_instance_t *)CONCAT44(local_ce8._4_4_,0xff << (local_c8c & 0x1f));
      local_ca0 = (ulong)(uint)((int)local_ca0 << 3);
      do {
        pBVar19 = local_cc8;
        pkVar29 = local_a20;
        lVar21 = 0;
        local_c80 = uVar18;
        do {
          kdf_init_from_seed((kdf_shake_t *)pkVar29,local_d30->seeds[lVar21],pBVar19,
                             (uint16_t)uVar18,(uint16_t)lVar21,lVar21 != 2,pp);
          pBVar25 = local_cf8;
          lVar21 = lVar21 + 1;
          pkVar29 = (kdf_shake_x4_t *)((pkVar29->sponge).state + 0xe0);
        } while (lVar21 != 3);
        lVar21 = 6;
        pmVar27 = (mzd_local_t *)local_c20;
        pkVar29 = local_a20;
        do {
          Keccak_HashSqueeze((Keccak_HashInstance *)pkVar29,local_d30->seeds[lVar21],
                             (ulong)(uint)(iVar17 * 8));
          pBVar25[(long)local_d30->seeds[lVar21]] =
               pBVar25[(long)local_d30->seeds[lVar21]] & (byte)local_ce8;
          mzd_from_char_array(pmVar27,local_d30->seeds[lVar21],local_cf0);
          lVar21 = lVar21 + 1;
          pkVar29 = (kdf_shake_x4_t *)((pkVar29->sponge).state + 0xe0);
          pmVar27 = pmVar27 + 1;
        } while (lVar21 == 7);
        uVar5 = (local_cd0->lowmc).n;
        if ((~DAT_001c939c & 0x20400) == 0) {
          if (uVar5 < 0x81) {
            local_be0._0_16_ =
                 vpternlogq_avx512vl(*(undefined1 (*) [16])local_c88->w64,local_c00,local_c20,0x96);
          }
          else {
            auVar13._16_16_ = auStack_bf0;
            auVar13._0_16_ = local_c00;
            auVar11._16_16_ = auStack_c10;
            auVar11._0_16_ = local_c20;
            local_be0._0_32_ =
                 vpternlogq_avx512vl(*(undefined1 (*) [32])local_c88->w64,auVar13,auVar11,0x96);
          }
        }
        else {
          local_be0._0_16_ =
               vpternlogq_avx512vl(*(undefined1 (*) [16])local_c88->w64,local_c00,local_c20,0x96);
          if (0x80 < uVar5) {
            local_be0._16_16_ =
                 vpternlogq_avx512vl(*(undefined1 (*) [16])(local_cd8->m_key[0].w64 + 2),auStack_bf0
                                     ,auStack_c10,0x96);
          }
        }
        mzd_to_char_array(local_d30->input_shares[2],(mzd_local_t *)local_be0,local_cf0);
        pvVar15 = local_c98;
        uVar18 = local_ca0;
        pkVar29 = local_a20;
        lVar21 = 0;
        do {
          Keccak_HashSqueeze((Keccak_HashInstance *)pkVar29,local_b80,uVar18);
          decompress_view(pvVar15,local_cd0,local_b80,(uint)lVar21);
          lVar21 = lVar21 + 1;
          pkVar29 = (kdf_shake_x4_t *)((pkVar29->sponge).state + 0xe0);
        } while (lVar21 != 3);
        pamVar28 = (mzd_local_t (*) [1])local_c20;
        (*local_c38)(local_cd8->m_plaintext,local_cc0,(in_out_shares_t *)pamVar28,pvVar15,local_c70)
        ;
        pp = local_cd0;
        uVar18 = local_cf0;
        lVar21 = 0;
        do {
          mzd_to_char_array(local_d30->output_shares[lVar21],*pamVar28,uVar18);
          compress_view(local_d30->communicated_bits[lVar21],pp,local_cc0,(uint)lVar21);
          hash_commitment(pp,local_d30,(uint)lVar21);
          lVar21 = lVar21 + 1;
          pamVar28 = pamVar28 + 1;
        } while (lVar21 != 3);
        if (local_cd8->unruh == true) {
          uVar34 = 0;
          do {
            unruh_G(pp,local_d30,uVar34,uVar34 == 2);
            uVar34 = uVar34 + 1;
          } while (uVar34 != 3);
        }
        uVar34 = (int)local_c80 + 1;
        uVar18 = (ulong)uVar34;
        local_d30 = local_d30 + 1;
      } while (uVar34 != local_cac);
    }
    uVar5 = pp->num_rounds;
    local_b80[0] = 1;
    if (pp->digest_size == ' ') {
      uVar36 = 0x540;
      uVar34 = 0x100;
    }
    else {
      uVar36 = 0x440;
      uVar34 = 0x200;
    }
    Keccak_HashInitialize((Keccak_HashInstance *)local_a20,uVar36,uVar34,0,'\x1f');
    Keccak_HashUpdate((Keccak_HashInstance *)local_a20,local_b80,8);
    pBVar19 = local_cc8;
    iVar17 = (uint)uVar5 * 0x18;
    Keccak_HashUpdate((Keccak_HashInstance *)local_a20,*(BitSequence **)(local_cc8 + 0x88),
                      (ulong)((uint)pp->input_output_size * iVar17));
    Keccak_HashUpdate((Keccak_HashInstance *)local_a20,*(BitSequence **)(pBVar19 + 0x40),
                      (ulong)((uint)pp->digest_size * iVar17));
    if (local_cd8->unruh == true) {
      Keccak_HashUpdate((Keccak_HashInstance *)local_a20,*(BitSequence **)(pBVar19 + 0xa0),
                        (ulong)((uint)uVar5 *
                                ((uint)pp->view_size + (uint)pp->view_size * 2 +
                                (uint)pp->input_output_size * 4) * 8));
    }
    H3_public_key_message((hash_context *)local_a20,pp,pBVar19,local_cd8);
    uVar37 = 0;
    Keccak_HashFinal((Keccak_HashInstance *)local_a20,(BitSequence *)0x0);
    _local_b80 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
    Keccak_HashSqueeze((Keccak_HashInstance *)local_a20,local_b80,(ulong)pp->digest_size << 3);
    H3_compute(pp,local_b80,*(uint8_t **)(pBVar19 + 0x20));
    uVar5 = pp->num_rounds;
    ppVar33 = (picnic_instance_t *)(ulong)uVar5;
    bVar1 = pp->view_size;
    local_cf0 = (ulong)bVar1;
    bVar2 = pp->input_output_size;
    local_cf8 = (BitSequence *)(ulong)bVar2;
    uVar18 = (ulong)pp->seed_size;
    bVar3 = pp->digest_size;
    if (ppVar33 != (picnic_instance_t *)0x0) {
      pbVar22 = *(byte **)(pBVar19 + 0x20);
      uVar37 = 0;
      do {
        uVar24 = uVar37;
        bVar4 = *pbVar22;
        uVar34 = (uint)bVar4 + (uint)bVar4 & 2 | (uint)(bVar4 >> 1);
        pbVar32 = local_c60 + (uVar24 >> 3);
        if ((uVar24 & 6) == 0) {
          iVar17 = 6;
        }
        else {
          *pbVar32 = *pbVar32 | (byte)(uVar34 << ((byte)(6 - ((byte)uVar24 & 6)) & 0x1f));
          pbVar32 = pbVar32 + 1;
          iVar17 = 8;
        }
        if ((uVar24 & 6) == 0) {
          *pbVar32 = (byte)(uVar34 << iVar17);
        }
        pbVar22 = pbVar22 + 1;
        uVar37 = uVar24 + 2;
      } while ((ulong)((uint)uVar5 + (uint)uVar5) != uVar24 + 2);
      uVar37 = uVar24 + 9 >> 3 & 0xffffffff;
    }
    uVar7 = *(undefined8 *)(pBVar19 + 8);
    uVar8 = *(undefined8 *)(pBVar19 + 0x10);
    uVar9 = *(undefined8 *)(pBVar19 + 0x18);
    puVar26 = local_c60 + uVar37 + 0x20;
    *(undefined8 *)(puVar26 + -0x20) = *(undefined8 *)pBVar19;
    *(undefined8 *)(puVar26 + -0x18) = uVar7;
    *(undefined8 *)(puVar26 + -0x10) = uVar8;
    *(undefined8 *)(puVar26 + -8) = uVar9;
    if (ppVar33 != (picnic_instance_t *)0x0) {
      local_ca8 = (undefined1 *)CONCAT44(local_ca8._4_4_,(uint)bVar1 + (uint)bVar2);
      puVar35 = pBVar19 + 0x68;
      ppVar23 = (picnic_instance_t *)0x0;
      local_ce8 = ppVar33;
      local_cb8 = local_cf8;
      do {
        bVar1 = *(byte *)((long)&(ppVar23->lowmc).n + *(long *)(pBVar19 + 0x20));
        uVar24 = (ulong)bVar1;
        uVar37 = (ulong)(bVar1 + 2 + ((bVar1 + 2) / 3) * -3);
        local_cd0 = ppVar23;
        memcpy(puVar26,*(void **)(puVar35 + uVar37 * 8 + -0x28),(ulong)bVar3);
        puVar26 = puVar26 + bVar3;
        if (*(void **)(puVar35 + uVar37 * 8 + 0x38) != (void *)0x0) {
          iVar17 = 0;
          if (uVar24 == 0) {
            iVar17 = (int)local_cf8;
          }
          uVar34 = iVar17 + (int)local_ca8;
          memcpy(puVar26,*(void **)(puVar35 + uVar37 * 8 + 0x38),(ulong)uVar34);
          puVar26 = puVar26 + uVar34;
        }
        uVar37 = local_cf0;
        uVar30 = (ulong)(bVar1 + 1 + ((bVar1 + 1) / 3) * -3);
        memcpy(puVar26,*(void **)(puVar35 + uVar30 * 8 + 8),local_cf0);
        puVar26 = puVar26 + uVar37;
        memcpy(puVar26,*(void **)(puVar35 + uVar24 * 8 + -0x40),uVar18);
        memcpy(puVar26 + uVar18,*(void **)(puVar35 + uVar30 * 8 + -0x40),uVar18);
        pBVar19 = local_cb8;
        puVar26 = puVar26 + uVar18 + uVar18;
        if (uVar24 != 0) {
          memcpy(puVar26,*(void **)puVar35,(size_t)local_cb8);
          puVar26 = puVar26 + (long)pBVar19;
        }
        ppVar23 = (picnic_instance_t *)((long)&(local_cd0->lowmc).n + 1);
        puVar35 = puVar35 + 0x90;
        pBVar19 = local_cc8;
      } while (local_ce8 != ppVar23);
    }
    pvVar15 = local_c98;
    *local_ba8 = (long)puVar26 - (long)local_c60;
    free(local_c78);
    free(pvVar15);
    free(local_cc0);
    free(*(void **)(pBVar19 + 0x20));
    free(pBVar19);
    free(local_c70);
    iVar17 = 0;
  }
  else {
    free(state);
    iVar17 = -2;
  }
  return iVar17;
}

Assistant:

int picnic_impl_sign(const picnic_instance_t* pp, const picnic_context_t* context, uint8_t* sig,
                     size_t* siglen) {
  const unsigned int num_rounds        = pp->num_rounds;
  const unsigned int input_output_size = pp->input_output_size;
  const unsigned int view_size         = pp->view_size;
  const unsigned int aview_size        = ALIGNU64T(view_size);
  const unsigned int diff              = input_output_size * 8 - pp->lowmc.n;

  const zkbpp_lowmc_implementation_f lowmc_impl = get_zkbpp_lowmc_implementation(&pp->lowmc);

  // Perform LowMC evaluation and record state before AND gates
  recorded_state_t* recorded_state =
      picnic_aligned_alloc(32, sizeof(recorded_state_t) * (pp->lowmc.r + 1));
  lowmc_record_state(&pp->lowmc, context->m_key, context->m_plaintext, recorded_state);
  // Validate public key
  {
    uint8_t public_key[MAX_LOWMC_BLOCK_SIZE] = {0};
    mzd_to_char_array(public_key, recorded_state[pp->lowmc.r].state, pp->input_output_size);
    const int check =
        picnic_timingsafe_bcmp(context->public_key, &public_key, pp->input_output_size);
    // check encodes the consistency of the embedded public key with the secret key and is safe to
    // leak.
    picnic_declassify(&check, sizeof(check));
    if (check) {
      picnic_aligned_free(recorded_state);
      return -2;
    }
  }

  sig_proof_t* prf = proof_new(pp, context);
  view_t* views    = picnic_aligned_alloc(32, sizeof(view_t) * pp->lowmc.r);

  in_out_shares_t in_out_shares;

  // Generate seeds
  generate_seeds(pp, context, prf->round[0].seeds[0], prf->salt);

  rvec_t* rvec =
      picnic_aligned_alloc(32, sizeof(rvec_t) * pp->lowmc.r); // random tapes for AND-gates
  uint8_t* tape_bytes_x4 = picnic_aligned_alloc(sizeof(uint64_t), SC_PROOF * 4 * aview_size);

  proof_round_t* round = prf->round;
  unsigned int i       = 0;
  for (; i < (num_rounds / 4) * 4; i += 4, round += 4) {
    // use 4 parallel instances of keccak for speedup
    {
      kdf_shake_x4_t kdfs[SC_PROOF];
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        const bool include_input_size   = (j != SC_PROOF - 1);
        const uint8_t* seeds[4]         = {round[0].seeds[j], round[1].seeds[j], round[2].seeds[j],
                                           round[3].seeds[j]};
        const uint16_t round_numbers[4] = {i, i + 1, i + 2, i + 3};
        kdf_init_x4_from_seed(&kdfs[j], seeds, prf->salt, round_numbers, j, include_input_size, pp);
      }

      // compute sharing
      for (unsigned int j = 0; j < SC_PROOF - 1; ++j) {
        kdf_shake_x4_get_randomness_4(&kdfs[j], round[0].input_shares[j], round[1].input_shares[j],
                                      round[2].input_shares[j], round[3].input_shares[j],
                                      input_output_size);
      }
      // compute random tapes
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        kdf_shake_x4_get_randomness_4(&kdfs[j], &tape_bytes_x4[(j * 4 + 0) * aview_size],
                                      &tape_bytes_x4[(j * 4 + 1) * aview_size],
                                      &tape_bytes_x4[(j * 4 + 2) * aview_size],
                                      &tape_bytes_x4[(j * 4 + 3) * aview_size], view_size);
        kdf_shake_x4_clear(&kdfs[j]);
      }
    }

    for (unsigned int round_offset = 0; round_offset < 4; round_offset++) {
      for (unsigned int j = 0; j < SC_PROOF - 1; ++j) {
        clear_padding_bits(&round[round_offset].input_shares[j][input_output_size - 1], diff);
        mzd_from_char_array(in_out_shares.s[j], round[round_offset].input_shares[j],
                            input_output_size);
      }
      mzd_share(&pp->lowmc, in_out_shares.s[2], in_out_shares.s[0], in_out_shares.s[1],
                context->m_key);
      mzd_to_char_array(round[round_offset].input_shares[SC_PROOF - 1],
                        in_out_shares.s[SC_PROOF - 1], input_output_size);

      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        decompress_random_tape(rvec, pp, &tape_bytes_x4[(j * 4 + round_offset) * aview_size], j);
      }

      // perform ZKB++ LowMC evaluation
      lowmc_impl(context->m_plaintext, views, &in_out_shares, rvec, recorded_state);

      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        mzd_to_char_array(round[round_offset].output_shares[j], in_out_shares.s[j],
                          input_output_size);
        compress_view(round[round_offset].communicated_bits[j], pp, views, j);
      }
    }

    // commitments
    for (unsigned int j = 0; j < SC_PROOF; ++j) {
      hash_commitment_x4(pp, round, j);
    }

#if defined(WITH_UNRUH)
    // unruh G
    if (context->unruh) {
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        unruh_G_x4(pp, round, j, j == SC_PROOF - 1);
      }
    }
#endif
  }
  for (; i < num_rounds; ++i, ++round) {
    {
      kdf_shake_t kdfs[SC_PROOF];
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        const bool include_input_size = (j != SC_PROOF - 1);
        kdf_init_from_seed(&kdfs[j], round->seeds[j], prf->salt, i, j, include_input_size, pp);
      }

      // compute sharing
      for (unsigned int j = 0; j < SC_PROOF - 1; ++j) {
        kdf_shake_get_randomness(&kdfs[j], round->input_shares[j], input_output_size);
        clear_padding_bits(&round->input_shares[j][input_output_size - 1], diff);
        mzd_from_char_array(in_out_shares.s[j], round->input_shares[j], input_output_size);
      }
      mzd_share(&pp->lowmc, in_out_shares.s[2], in_out_shares.s[0], in_out_shares.s[1],
                context->m_key);
      mzd_to_char_array(round->input_shares[SC_PROOF - 1], in_out_shares.s[SC_PROOF - 1],
                        input_output_size);

      // compute random tapes
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        assert(view_size <= MAX_VIEW_SIZE);
        uint8_t tape_bytes[MAX_VIEW_SIZE];
        kdf_shake_get_randomness(&kdfs[j], tape_bytes, view_size);
        decompress_random_tape(rvec, pp, tape_bytes, j);
      }

      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        kdf_shake_clear(&kdfs[j]);
      }
    }

    // perform ZKB++ LowMC evaluation
    lowmc_impl(context->m_plaintext, views, &in_out_shares, rvec, recorded_state);

    // commitments
    for (unsigned int j = 0; j < SC_PROOF; ++j) {
      mzd_to_char_array(round->output_shares[j], in_out_shares.s[j], input_output_size);
      compress_view(round->communicated_bits[j], pp, views, j);
      hash_commitment(pp, round, j);
    }

#if defined(WITH_UNRUH)
    // unruh G
    if (context->unruh) {
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        unruh_G(pp, round, j, j == SC_PROOF - 1);
      }
    }
#endif
  }
  H3(pp, prf, context);

  const int ret = sig_proof_to_char_array(pp, prf, sig, siglen);

  // clean up
  picnic_aligned_free(tape_bytes_x4);
  picnic_aligned_free(rvec);
  picnic_aligned_free(views);
  proof_free(prf);
  picnic_aligned_free(recorded_state);
  return ret;
}